

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhileStatement.h
# Opt level: O0

void __thiscall WhileStatement::execute(WhileStatement *this,Environment *env)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  BreakPacket *anon_var_0;
  ContinuePacket *anon_var_0_1;
  shared_ptr<Value> local_60;
  undefined1 local_50 [8];
  Environment local;
  Environment *env_local;
  WhileStatement *this_local;
  
  local.symbols._M_h._M_single_bucket = (__node_base_ptr)env;
  Environment::Environment((Environment *)local_50,env);
  while( true ) {
    peVar2 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->condition);
    (**peVar2->_vptr_Expression)(&local_60,peVar2,local_50);
    peVar3 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &local_60);
    uVar1 = (*(peVar3->super_Member)._vptr_Member[5])();
    std::shared_ptr<Value>::~shared_ptr(&local_60);
    if ((uVar1 & 1) == 0) break;
    peVar4 = std::__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->statementBlock);
    (**(peVar4->super_Statement)._vptr_Statement)(peVar4,local_50);
  }
  Environment::~Environment((Environment *)local_50);
  return;
}

Assistant:

void execute(Environment *env) override {
        Environment local = *env;
        while(condition->evaluate(&local) -> asBoolean()) {
            try {
                statementBlock->execute(&local);
            } catch (BreakPacket &) {
                break;
            } catch (ContinuePacket &) {}
        }
    }